

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenFunctionRef BinaryenGetFunctionByIndex(BinaryenModuleRef module,BinaryenIndex index)

{
  pointer puVar1;
  Fatal local_198;
  
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(module->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (BinaryenFunctionRef)
           ((_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
           puVar1[index]._M_t.
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t).
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>;
  }
  wasm::Fatal::Fatal(&local_198);
  wasm::Fatal::operator<<(&local_198,(char (*) [24])"invalid function index.");
  wasm::Fatal::~Fatal(&local_198);
}

Assistant:

BinaryenFunctionRef BinaryenGetFunctionByIndex(BinaryenModuleRef module,
                                               BinaryenIndex index) {
  const auto& functions = ((Module*)module)->functions;
  if (functions.size() <= index) {
    Fatal() << "invalid function index.";
  }
  return functions[index].get();
}